

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::Matchers::Impl::StdString::StartsWith::match(StartsWith *this,string *expr)

{
  long lVar1;
  string *in_RDI;
  byte bVar2;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  string local_30 [48];
  
  CasedString::adjustString
            ((CasedString *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),in_RDI);
  lVar1 = std::__cxx11::string::find(local_30,(ulong)(in_RDI + 0x18));
  bVar2 = lVar1 == 0;
  std::__cxx11::string::~string(local_30);
  return (bool)(bVar2 & 1);
}

Assistant:

virtual bool match( std::string const& expr ) const {
                return m_data.adjustString( expr ).find( m_data.m_str ) == 0;
            }